

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O3

parse_status_t matchstr(char *str,size_t slen,char *fmt,...)

{
  char cVar1;
  char in_AL;
  parse_status_t pVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg_list;
  membuffer buf;
  __va_list_tag local_138;
  scanner_t local_120;
  membuffer local_108;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  cVar1 = str[slen];
  str[slen] = '\0';
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  membuffer_init(&local_108);
  membuffer_attach(&local_108,str,slen);
  local_120.cursor = 0;
  local_120.entire_msg_loaded = 1;
  local_138.gp_offset = 0x18;
  local_138.fp_offset = 0x30;
  local_138.overflow_arg_area = &arg_list[0].overflow_arg_area;
  local_138.reg_save_area = local_e8;
  local_120.msg = &local_108;
  pVar2 = vfmatch(&local_120,fmt,&local_138);
  str[slen] = cVar1;
  return pVar2;
}

Assistant:

parse_status_t matchstr(char *str, size_t slen, const char *fmt, ...)
{
	parse_status_t ret_code;
	char save_char;
	scanner_t scanner;
	membuffer buf;
	va_list arg_list;

	/* null terminate str */
	save_char = str[slen];
	str[slen] = '\0';

	membuffer_init(&buf);

	/* under no circumstances should this buffer be modifed because its
	 * memory */
	/*  might have not come from malloc() */
	membuffer_attach(&buf, str, slen);

	scanner_init(&scanner, &buf);
	scanner.entire_msg_loaded = 1;

	va_start(arg_list, fmt);
	ret_code = vfmatch(&scanner, fmt, arg_list);
	va_end(arg_list);

	/* restore str */
	str[slen] = save_char;

	/* don't destroy buf */

	return ret_code;
}